

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O1

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  long lVar1;
  Arg *pAVar2;
  pointer ppAVar3;
  _List_node_base *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long *plVar9;
  pointer ppAVar10;
  ulong uVar11;
  _List_node_base *p_Var12;
  bool bVar13;
  bool bVar14;
  string s;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  string progName;
  XorHandler xorHandler;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> local_f0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80;
  int local_78;
  undefined4 uStack_74;
  undefined1 local_70 [16];
  StdOutput *local_60;
  ostream *local_58;
  ulong local_50;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_48;
  
  iVar5 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&local_f0,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar5));
  iVar5 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  local_80 = local_70;
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,lVar1,((long *)CONCAT44(extraout_var_00,iVar5))[1] + lVar1);
  iVar5 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_48,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar5));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_b8,&local_48);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_80,local_80 + CONCAT44(uStack_74,local_78));
  local_60 = this;
  local_58 = os;
  std::__cxx11::string::append((char *)&local_130);
  if (local_b8.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      std::__cxx11::string::append((char *)&local_130);
      local_50 = uVar11;
      for (ppAVar10 = local_b8.
                      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].
                      super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          ppAVar10 !=
          local_b8.
          super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppAVar10 = ppAVar10 + 1) {
        pAVar2 = *ppAVar10;
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
        (*pAVar2->_vptr_Arg[8])(local_a0,pAVar2,(string *)local_d8);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_a0);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_100 = *plVar9;
          lStack_f8 = plVar6[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar9;
          local_110 = (long *)*plVar6;
        }
        local_108 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
      }
      local_130._M_dataplus._M_p[local_130._M_string_length - 1] = '}';
      uVar11 = local_50 + 1;
      uVar7 = ((long)local_b8.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
  }
  if (local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_f0) {
    p_Var12 = local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node
              .super__List_node_base._M_next;
    do {
      bVar13 = (long)local_48.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0;
      if (bVar13) {
        uVar11 = ((long)local_48.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar13 = true;
        uVar7 = 0;
        do {
          ppAVar10 = local_48.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                     super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar3 = local_48.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                    super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar14 = ppAVar10 == ppAVar3;
          if (!bVar14) {
            pAVar2 = *ppAVar10;
            while (pAVar2 != (Arg *)p_Var12[1]._M_next) {
              ppAVar10 = ppAVar10 + 1;
              bVar14 = ppAVar10 == ppAVar3;
              if (bVar14) goto LAB_00125b79;
              pAVar2 = *ppAVar10;
            }
            if (!bVar14) break;
          }
LAB_00125b79:
          uVar7 = uVar7 + 1;
          bVar13 = uVar7 <= uVar11 && uVar11 - uVar7 != 0;
        } while (uVar7 != uVar11 + (uVar11 == 0));
      }
      if (!bVar13) {
        p_Var4 = p_Var12[1]._M_next;
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
        (*(code *)p_Var4->_M_next[4]._M_next)(local_a0,p_Var4,(string *)local_d8);
        puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x130fde)
        ;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_100 = *plVar6;
          lStack_f8 = puVar8[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar6;
          local_110 = (long *)*puVar8;
        }
        local_108 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
      }
      p_Var12 = p_Var12->_M_next;
    } while (p_Var12 != (_List_node_base *)&local_f0);
  }
  iVar5 = 0x23;
  if (local_78 < 0x23) {
    iVar5 = local_78;
  }
  spacePrint(local_60,local_58,&local_130,0x4b,3,iVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_48);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  while (local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_f0) {
    p_Var12 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
               &(local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    _M_node.super__List_node_base._M_next);
    local_f0.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var12;
  }
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}